

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_tpl.h
# Opt level: O0

uint32_t longest_match_slow_sse2(deflate_state *s,Pos cur_match)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  ushort uVar8;
  undefined4 uVar9;
  int32_t iVar10;
  uint32_t uVar11;
  uint uVar12;
  uint uVar13;
  void *ptr;
  ushort in_SI;
  long in_RDI;
  bool bVar14;
  uchar *scan_endstr;
  uint32_t hash_1;
  uint32_t i_1;
  Pos next_pos;
  Pos pos_1;
  uint32_t match_start;
  uint32_t len;
  Pos pos;
  uint32_t hash;
  uint32_t i;
  uint64_t scan_end;
  uint64_t scan_start;
  Pos match_offset;
  uint32_t lookahead;
  uint32_t offset;
  uint32_t best_len;
  uint32_t nice_match;
  uint32_t chain_length;
  Pos limit_base;
  Pos limit;
  Pos *prev;
  uchar *mbase_end;
  uchar *mbase_start;
  uchar *scan;
  uchar *window;
  uint wmask;
  uint strstart;
  void *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  uint local_a8;
  uint local_a4;
  uint local_94;
  ushort local_90;
  uint local_80;
  uint local_7c;
  ushort local_62;
  uint local_5c;
  uint local_58;
  uint local_50;
  ushort local_4a;
  long local_38;
  ushort local_12;
  
  uVar2 = *(uint *)(in_RDI + 0x84);
  uVar3 = *(uint *)(in_RDI + 0x48);
  lVar6 = *(long *)(in_RDI + 0x58);
  ptr = (void *)(lVar6 + (ulong)uVar2);
  lVar7 = *(long *)(in_RDI + 0x60);
  uVar4 = *(uint *)(in_RDI + 0x4c);
  local_62 = 0;
  if (*(int *)(in_RDI + 0x8c) == 0) {
    local_a4 = 2;
  }
  else {
    local_a4 = *(uint *)(in_RDI + 0x8c);
  }
  local_58 = local_a4;
  local_5c = local_a4 - 1;
  if ((3 < local_a4) && (local_5c = local_a4 - 3, 7 < local_a4)) {
    local_5c = local_a4 - 7;
  }
  zng_memread_8(ptr);
  zng_memread_8((void *)((long)ptr + (ulong)local_5c));
  local_50 = *(uint *)(in_RDI + 0x90);
  if (*(uint *)(in_RDI + 0xb8) <= local_a4) {
    local_50 = local_50 >> 2;
  }
  uVar5 = *(uint *)(in_RDI + 0xbc);
  if (*(int *)(in_RDI + 0x40) - 0x106U < uVar2) {
    local_a8 = uVar2 - (*(int *)(in_RDI + 0x40) + -0x106) & 0xffff;
  }
  else {
    local_a8 = 0;
  }
  uVar8 = (ushort)local_a8;
  local_4a = uVar8;
  local_38 = lVar6;
  local_12 = in_SI;
  if (2 < local_a4) {
    uVar9 = (**(code **)(in_RDI + 0x98))(0,*(undefined1 *)((long)ptr + 1));
    local_80 = (**(code **)(in_RDI + 0x98))(uVar9,*(undefined1 *)((long)ptr + 2));
    for (local_7c = 3; local_7c <= local_a4; local_7c = local_7c + 1) {
      local_80 = (**(code **)(in_RDI + 0x98))(local_80,*(undefined1 *)((long)ptr + (ulong)local_7c))
      ;
      uVar1 = *(ushort *)(*(long *)(in_RDI + 0x68) + (ulong)local_80 * 2);
      if (uVar1 < local_12) {
        local_62 = (short)local_7c - 2;
        local_12 = uVar1;
      }
    }
    local_4a = uVar8 + local_62;
    if (local_12 <= local_4a) {
LAB_00171533:
      if (local_58 < *(uint *)(in_RDI + 0x4c)) {
        return local_58;
      }
      return *(uint32_t *)(in_RDI + 0x4c);
    }
    local_38 = lVar6 - (int)(uint)local_62;
  }
LAB_00170fa7:
  do {
    if (uVar2 <= local_12) {
      return local_58;
    }
    if (local_58 < 4) {
      while ((iVar10 = zng_memcmp_2((void *)CONCAT17(in_stack_ffffffffffffff57,
                                                     in_stack_ffffffffffffff50),
                                    in_stack_ffffffffffffff48), iVar10 != 0 ||
             (iVar10 = zng_memcmp_2((void *)CONCAT17(in_stack_ffffffffffffff57,
                                                     in_stack_ffffffffffffff50),
                                    in_stack_ffffffffffffff48), iVar10 != 0))) {
        local_50 = local_50 - 1;
        if ((local_50 == 0) ||
           (local_12 = *(ushort *)(lVar7 + (ulong)(local_12 & uVar3) * 2), local_12 <= local_4a)) {
          return local_58;
        }
      }
    }
    else if (local_58 < 8) {
      while ((iVar10 = zng_memcmp_4((void *)CONCAT17(in_stack_ffffffffffffff57,
                                                     in_stack_ffffffffffffff50),
                                    in_stack_ffffffffffffff48), iVar10 != 0 ||
             (iVar10 = zng_memcmp_4((void *)CONCAT17(in_stack_ffffffffffffff57,
                                                     in_stack_ffffffffffffff50),
                                    in_stack_ffffffffffffff48), iVar10 != 0))) {
        local_50 = local_50 - 1;
        if ((local_50 == 0) ||
           (local_12 = *(ushort *)(lVar7 + (ulong)(local_12 & uVar3) * 2), local_12 <= local_4a)) {
          return local_58;
        }
      }
    }
    else {
      while ((iVar10 = zng_memcmp_8((void *)CONCAT17(in_stack_ffffffffffffff57,
                                                     in_stack_ffffffffffffff50),
                                    in_stack_ffffffffffffff48), iVar10 != 0 ||
             (iVar10 = zng_memcmp_8((void *)CONCAT17(in_stack_ffffffffffffff57,
                                                     in_stack_ffffffffffffff50),
                                    in_stack_ffffffffffffff48), iVar10 != 0))) {
        local_50 = local_50 - 1;
        if ((local_50 == 0) ||
           (local_12 = *(ushort *)(lVar7 + (ulong)(local_12 & uVar3) * 2), local_12 <= local_4a)) {
          return local_58;
        }
      }
    }
    uVar11 = compare256_sse2_static
                       ((uint8_t *)((long)ptr + 2),(uint8_t *)(local_38 + (int)(uint)local_12 + 2));
    uVar12 = uVar11 + 2;
    if (local_58 < uVar12) {
      *(uint *)(in_RDI + 0x88) = (uint)local_12 - (uint)local_62;
      if (uVar4 < uVar12) {
        return uVar4;
      }
      if (uVar5 <= uVar12) {
        return uVar12;
      }
      local_5c = uVar11 + 1;
      if ((3 < uVar12) && (local_5c = uVar11 - 1, 7 < uVar12)) {
        local_5c = uVar11 - 5;
      }
      zng_memread_8((void *)((long)ptr + (ulong)local_5c));
      bVar14 = ((uint)local_12 - (uint)local_62) + uVar12 < uVar2;
      in_stack_ffffffffffffff57 = 3 < uVar12 && bVar14;
      local_58 = uVar12;
      if (3 < uVar12 && bVar14) {
        local_12 = local_12 - local_62;
        local_62 = 0;
        local_90 = local_12;
        for (local_94 = 0; local_94 <= uVar11 - 1; local_94 = local_94 + 1) {
          uVar1 = *(ushort *)(lVar7 + (ulong)(local_12 + local_94 & uVar3) * 2);
          if (uVar1 < local_90) {
            if ((uint)uVar1 <= local_a8 + local_94) goto LAB_00171533;
            local_62 = (ushort)local_94;
            local_90 = uVar1;
          }
        }
        local_12 = local_90;
        uVar9 = (**(code **)(in_RDI + 0x98))(0,*(undefined1 *)((long)ptr + ((ulong)uVar12 - 4)));
        uVar9 = (**(code **)(in_RDI + 0x98))(uVar9,*(undefined1 *)((long)ptr + ((ulong)uVar12 - 3)))
        ;
        uVar13 = (**(code **)(in_RDI + 0x98))
                           (uVar9,*(undefined1 *)((long)ptr + ((ulong)uVar12 - 2)));
        uVar1 = *(ushort *)(*(long *)(in_RDI + 0x68) + (ulong)uVar13 * 2);
        if ((uVar1 < local_90) &&
           (local_62 = (short)uVar12 - 4, local_12 = uVar1, (uint)uVar1 <= local_a8 + local_62))
        goto LAB_00171533;
        local_4a = uVar8 + local_62;
        local_38 = lVar6 - (int)(uint)local_62;
        goto LAB_00170fa7;
      }
    }
    local_50 = local_50 - 1;
    if ((local_50 == 0) ||
       (local_12 = *(ushort *)(lVar7 + (ulong)(local_12 & uVar3) * 2), local_12 <= local_4a)) {
      return local_58;
    }
  } while( true );
}

Assistant:

Z_INTERNAL uint32_t LONGEST_MATCH(deflate_state *const s, Pos cur_match) {
    unsigned int strstart = s->strstart;
    const unsigned wmask = s->w_mask;
    unsigned char *window = s->window;
    unsigned char *scan = window + strstart;
    Z_REGISTER unsigned char *mbase_start = window;
    Z_REGISTER unsigned char *mbase_end;
    const Pos *prev = s->prev;
    Pos limit;
#ifdef LONGEST_MATCH_SLOW
    Pos limit_base;
#else
    int32_t early_exit;
#endif
    uint32_t chain_length, nice_match, best_len, offset;
    uint32_t lookahead = s->lookahead;
    Pos match_offset = 0;
    uint64_t scan_start;
    uint64_t scan_end;

#define GOTO_NEXT_CHAIN \
    if (--chain_length && (cur_match = prev[cur_match & wmask]) > limit) \
        continue; \
    return best_len;

    /* The code is optimized for STD_MAX_MATCH-2 multiple of 16. */
    Assert(STD_MAX_MATCH == 258, "Code too clever");

    best_len = s->prev_length ? s->prev_length : STD_MIN_MATCH-1;

    /* Calculate read offset which should only extend an extra byte
     * to find the next best match length.
     */
    offset = best_len-1;
    if (best_len >= sizeof(uint32_t)) {
        offset -= 2;
        if (best_len >= sizeof(uint64_t))
            offset -= 4;
    }

    scan_start = zng_memread_8(scan);
    scan_end = zng_memread_8(scan+offset);
    mbase_end  = (mbase_start+offset);

    /* Do not waste too much time if we already have a good match */
    chain_length = s->max_chain_length;
    if (best_len >= s->good_match)
        chain_length >>= 2;
    nice_match = (uint32_t)s->nice_match;

    /* Stop when cur_match becomes <= limit. To simplify the code,
     * we prevent matches with the string of window index 0
     */
    limit = strstart > MAX_DIST(s) ? (Pos)(strstart - MAX_DIST(s)) : 0;
#ifdef LONGEST_MATCH_SLOW
    limit_base = limit;
    if (best_len >= STD_MIN_MATCH) {
        /* We're continuing search (lazy evaluation). */
        uint32_t i, hash;
        Pos pos;

        /* Find a most distant chain starting from scan with index=1 (index=0 corresponds
         * to cur_match). We cannot use s->prev[strstart+1,...] immediately, because
         * these strings are not yet inserted into the hash table.
         */
        hash = s->update_hash(0, scan[1]);
        hash = s->update_hash(hash, scan[2]);

        for (i = 3; i <= best_len; i++) {
            hash = s->update_hash(hash, scan[i]);

            /* If we're starting with best_len >= 3, we can use offset search. */
            pos = s->head[hash];
            if (pos < cur_match) {
                match_offset = (Pos)(i - 2);
                cur_match = pos;
            }
        }

        /* Update offset-dependent variables */
        limit = limit_base+match_offset;
        if (cur_match <= limit)
            goto break_matching;
        mbase_start -= match_offset;
        mbase_end -= match_offset;
    }
#else
    early_exit = s->level < EARLY_EXIT_TRIGGER_LEVEL;
#endif
    Assert((unsigned long)strstart <= s->window_size - MIN_LOOKAHEAD, "need lookahead");
    for (;;) {
        if (cur_match >= strstart)
            break;

        /* Skip to next match if the match length cannot increase or if the match length is
         * less than 2. Note that the checks below for insufficient lookahead only occur
         * occasionally for performance reasons.
         * Therefore uninitialized memory will be accessed and conditional jumps will be made
         * that depend on those values. However the length of the match is limited to the
         * lookahead, so the output of deflate is not affected by the uninitialized values.
         */
        if (best_len < sizeof(uint32_t)) {
            for (;;) {
                if (zng_memcmp_2(mbase_end+cur_match, &scan_end) == 0 &&
                    zng_memcmp_2(mbase_start+cur_match, &scan_start) == 0)
                    break;
                GOTO_NEXT_CHAIN;
            }
        } else if (best_len >= sizeof(uint64_t)) {
            for (;;) {
                if (zng_memcmp_8(mbase_end+cur_match, &scan_end) == 0 &&
                    zng_memcmp_8(mbase_start+cur_match, &scan_start) == 0)
                    break;
                GOTO_NEXT_CHAIN;
            }
        } else {
            for (;;) {
                if (zng_memcmp_4(mbase_end+cur_match, &scan_end) == 0 &&
                    zng_memcmp_4(mbase_start+cur_match, &scan_start) == 0)
                    break;
                GOTO_NEXT_CHAIN;
            }
        }
        uint32_t len = COMPARE256(scan+2, mbase_start+cur_match+2) + 2;
        Assert(scan+len <= window+(unsigned)(s->window_size-1), "wild scan");

        if (len > best_len) {
            uint32_t match_start = cur_match - match_offset;
            s->match_start = match_start;

            /* Do not look for matches beyond the end of the input. */
            if (len > lookahead)
                return lookahead;
            best_len = len;
            if (best_len >= nice_match)
                return best_len;

            offset = best_len-1;
            if (best_len >= sizeof(uint32_t)) {
                offset -= 2;
                if (best_len >= sizeof(uint64_t))
                    offset -= 4;
            }

            scan_end = zng_memread_8(scan+offset);

#ifdef LONGEST_MATCH_SLOW
            /* Look for a better string offset */
            if (UNLIKELY(len > STD_MIN_MATCH && match_start + len < strstart)) {
                Pos pos, next_pos;
                uint32_t i, hash;
                unsigned char *scan_endstr;

                /* Go back to offset 0 */
                cur_match -= match_offset;
                match_offset = 0;
                next_pos = cur_match;
                for (i = 0; i <= len - STD_MIN_MATCH; i++) {
                    pos = prev[(cur_match + i) & wmask];
                    if (pos < next_pos) {
                        /* Hash chain is more distant, use it */
                        if (pos <= limit_base + i)
                            goto break_matching;
                        next_pos = pos;
                        match_offset = (Pos)i;
                    }
                }
                /* Switch cur_match to next_pos chain */
                cur_match = next_pos;

                /* Try hash head at len-(STD_MIN_MATCH-1) position to see if we could get
                 * a better cur_match at the end of string. Using (STD_MIN_MATCH-1) lets
                 * us include one more byte into hash - the byte which will be checked
                 * in main loop now, and which allows to grow match by 1.
                 */
                scan_endstr = scan + len - (STD_MIN_MATCH+1);

                hash = s->update_hash(0, scan_endstr[0]);
                hash = s->update_hash(hash, scan_endstr[1]);
                hash = s->update_hash(hash, scan_endstr[2]);

                pos = s->head[hash];
                if (pos < cur_match) {
                    match_offset = (Pos)(len - (STD_MIN_MATCH+1));
                    if (pos <= limit_base + match_offset)
                        goto break_matching;
                    cur_match = pos;
                }

                /* Update offset-dependent variables */
                limit = limit_base+match_offset;
                mbase_start = window-match_offset;
                mbase_end = (mbase_start+offset);
                continue;
            }
#endif
            mbase_end = (mbase_start+offset);
        }
#ifndef LONGEST_MATCH_SLOW
        else if (UNLIKELY(early_exit)) {
            /* The probability of finding a match later if we here is pretty low, so for
             * performance it's best to outright stop here for the lower compression levels
             */
            break;
        }
#endif
        GOTO_NEXT_CHAIN;
    }
    return best_len;

#ifdef LONGEST_MATCH_SLOW
break_matching:

    if (best_len < s->lookahead)
        return best_len;

    return s->lookahead;
#endif
}